

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPoints.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderPointsVerification::deinit(TessellationShaderPointsVerification *this)

{
  TessellationShaderUtils *this_00;
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  TessellationShaderPointsVerification *this_local;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) != 0) {
    pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0xd8))(0);
    if (this->m_utils != (TessellationShaderUtils *)0x0) {
      this_00 = this->m_utils;
      if (this_00 != (TessellationShaderUtils *)0x0) {
        TessellationShaderUtils::~TessellationShaderUtils(this_00);
        operator_delete(this_00,0x20);
      }
      this->m_utils = (TessellationShaderUtils *)0x0;
    }
    if (this->m_vao_id != 0) {
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x490))(1,&this->m_vao_id);
      this->m_vao_id = 0;
    }
  }
  return;
}

Assistant:

void TessellationShaderPointsVerification::deinit()
{
	/* Call base class' deinit() */
	TestCaseBase::deinit();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Unbind vertex array object */
	gl.bindVertexArray(0);

	/* Delete utils instances */
	if (m_utils != DE_NULL)
	{
		delete m_utils;

		m_utils = DE_NULL;
	}

	/* Delete vertex array object */
	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}
}